

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileStorageCommitState::SingleFileStorageCommitState
          (SingleFileStorageCommitState *this,StorageManager *storage,WriteAheadLog *wal)

{
  idx_t iVar1;
  idx_t iVar2;
  
  (this->super_StorageCommitState)._vptr_StorageCommitState =
       (_func_int **)&PTR__SingleFileStorageCommitState_027a0360;
  this->initial_wal_size = 0;
  this->initial_written = 0;
  this->wal = wal;
  this->state = IN_PROGRESS;
  (this->optimistically_written_data)._M_h._M_buckets =
       &(this->optimistically_written_data)._M_h._M_single_bucket;
  (this->optimistically_written_data)._M_h._M_bucket_count = 1;
  (this->optimistically_written_data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->optimistically_written_data)._M_h._M_element_count = 0;
  (this->optimistically_written_data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->optimistically_written_data)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->optimistically_written_data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar1 = StorageManager::GetWALSize(storage);
  iVar2 = WriteAheadLog::GetTotalWritten(wal);
  this->initial_written = iVar2;
  this->initial_wal_size = iVar1;
  return;
}

Assistant:

SingleFileStorageCommitState::SingleFileStorageCommitState(StorageManager &storage, WriteAheadLog &wal)
    : wal(wal), state(WALCommitState::IN_PROGRESS) {
	auto initial_size = storage.GetWALSize();
	initial_written = wal.GetTotalWritten();
	initial_wal_size = initial_size;
}